

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  cpp_dec_float<200U,_int,_void> *this_00;
  cpp_dec_float<200U,_int,_void> *this_01;
  bool bVar1;
  pointer pnVar2;
  undefined8 uVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  byte bVar16;
  Real a;
  type t;
  int local_1e4;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint local_158 [3];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  fpclass_type local_138;
  undefined8 uStack_130;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar16 = 0;
  uVar6 = (uint)((ulong)((long)(x->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(x->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 7);
  if (uVar6 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    (x->super_IdxSet).num = 0;
  }
  else {
    if ((int)uVar6 < 1) {
      local_1e4 = 0;
    }
    else {
      uVar10 = 0;
      this_01 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
      local_1e4 = 0;
      do {
        pnVar2 = (x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = &pnVar2[uVar10].m_backend;
        if (pnVar2[uVar10].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00525744:
          pcVar11 = this_00;
          puVar12 = local_a0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar12 = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar16 * -8 + 4);
            puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
          }
          iVar7 = this_00->exp;
          bVar1 = this_00->neg;
          uVar3._0_4_ = this_00->fpclass;
          uVar3._4_4_ = this_00->prec_elem;
          uStack_130 = 0;
          _local_138 = uVar3;
          a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
          puVar12 = local_a0;
          pcVar11 = &local_120;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar12;
            puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_120.neg = bVar1;
          if ((bVar1 == true) &&
             (local_120.data._M_elems[0] != 0 || local_138 != cpp_dec_float_finite)) {
            local_120.neg = false;
          }
          local_120.exp = iVar7;
          local_120._120_8_ = uVar3;
          if ((local_138 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_140._0_4_ = cpp_dec_float_finite;
            local_140._4_4_ = 0x1c;
            local_1b8 = (undefined1  [16])0x0;
            local_1a8 = (undefined1  [16])0x0;
            local_198 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_178 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_158[0] = 0;
            local_158[1] = 0;
            stack0xfffffffffffffeb0 = 0;
            uStack_14b = 0;
            iStack_148 = 0;
            bStack_144 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)this_01,a);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_120,this_01);
            if (0 < iVar7) {
              pIVar4 = (A->set).theitem;
              iVar7 = (A->set).thekey[uVar10].idx;
              lVar8 = (long)local_1e4;
              local_1e4 = local_1e4 + 1;
              (x->super_IdxSet).idx[lVar8] = (int)uVar10;
              lVar8 = (long)pIVar4[iVar7].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
              if (0 < lVar8) {
                lVar15 = lVar8 + 1;
                lVar8 = lVar8 * 0x84;
                do {
                  pNVar5 = pIVar4[iVar7].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem;
                  pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)&pNVar5[-1].val.m_backend.data + lVar8);
                  local_140._0_4_ = cpp_dec_float_finite;
                  local_140._4_4_ = 0x1c;
                  local_158[0] = 0;
                  local_158[1] = 0;
                  stack0xfffffffffffffeb0 = 0;
                  local_168 = ZEXT816(0);
                  local_178 = ZEXT816(0);
                  local_188 = ZEXT816(0);
                  local_198 = ZEXT816(0);
                  local_1a8 = ZEXT816(0);
                  local_1b8 = ZEXT816(0);
                  uStack_14b = 0;
                  iStack_148 = 0;
                  bStack_144 = false;
                  pcVar13 = pcVar11;
                  if (pcVar11 == this_01) {
                    pcVar13 = this_00;
                  }
                  if (pcVar11 != this_01 && this_01 != this_00) {
                    pcVar13 = this_00;
                    pcVar14 = this_01;
                    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                      (pcVar14->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                      pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar13 + (ulong)bVar16 * -8 + 4);
                      pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar14 + (ulong)bVar16 * -8 + 4);
                    }
                    iStack_148 = this_00->exp;
                    bStack_144 = this_00->neg;
                    local_140._0_4_ = this_00->fpclass;
                    local_140._4_4_ = this_00->prec_elem;
                    pcVar13 = pcVar11;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                            (this_01,pcVar13);
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)*(int *)((long)(&pNVar5[-1].val + 1) + lVar8) * 0x80 +
                             *(long *)(this + 0x20)),this_01);
                  lVar15 = lVar15 + -1;
                  lVar8 = lVar8 + -0x84;
                } while (1 < lVar15);
              }
              goto LAB_005259dd;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (this_01,0,(type *)0x0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (this_00,this_01);
          if (iVar7 != 0) goto LAB_00525744;
        }
LAB_005259dd:
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar6 & 0x7fffffff));
    }
    (x->super_IdxSet).num = local_1e4;
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
  }
  x->setupStatus = true;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productAndSetup(const SVSetBase<S>& A, SSVectorBase<T>& x)
{
   assert(!x.isSetup());

   if(x.dim() == 0)
   {
      // x == 0 => this := zero vector
      clear();
      x.num = 0;
   }
   else
   {
      // x is not setup, so walk through its value vector
      int nzcount = 0;
      int end = x.dim();

      for(int i = 0; i < end; ++i)
      {
         // advance to the next element != 0
         T& xval = x.val[i];

         if(xval != 0)
         {
            // If x[i] is really nonzero, compute A[i] * x[i] and adapt x.idx,
            // otherwise set x[i] to 0.
            if(isNotZero(xval, this->tolerances()->epsilon()))
            {
               const SVectorBase<S>& Ai = A[i];
               x.idx[ nzcount++ ] = i;

               for(int j = Ai.size() - 1; j >= 0; --j)
               {
                  const Nonzero<S>& elt = Ai.element(j);
                  VectorBase<R>::val[elt.idx] += xval * elt.val;
               }
            }
            else
               xval = 0;
         }
      }

      x.num = nzcount;
      setupStatus = false;
   }

   x.setupStatus = true;

   assert(isConsistent());

   return *this;
}